

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string_maker<lest::approx> * __thiscall
lest::string_maker<lest::approx>::to_string_abi_cxx11_
          (string_maker<lest::approx> *this,approx *value)

{
  ostream *os_00;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream os;
  approx *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  os_00 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
  lest::operator<<(os_00,value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }